

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void dropCell(MemPage *pPage,int idx,int sz,int *pRC)

{
  ulong uVar1;
  u8 uVar2;
  u8 uVar3;
  u8 uVar4;
  u8 uVar5;
  u8 *puVar6;
  u8 *puVar7;
  u8 *puVar8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  ushort uVar15;
  uint uVar16;
  undefined8 uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  
  if (*pRC != 0) {
    return;
  }
  puVar6 = pPage->aData;
  puVar7 = pPage->aCellIdx;
  lVar19 = (long)idx;
  uVar2 = puVar7[lVar19 * 2];
  uVar3 = puVar7[lVar19 * 2 + 1];
  uVar10 = CONCAT11(uVar2,uVar3);
  uVar12 = (ulong)pPage->hdrOffset;
  if (((uint)uVar10 <
       (uint)(ushort)(*(ushort *)(puVar6 + uVar12 + 5) << 8 | *(ushort *)(puVar6 + uVar12 + 5) >> 8)
      ) || (pPage->pBt->usableSize < (uint)uVar10 + sz)) {
    sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd79b,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
    *pRC = 0xb;
    return;
  }
  if ((pPage->pBt->btsFlags & 4) != 0) {
    memset(puVar6 + uVar10,0,(long)sz);
  }
  puVar7 = puVar7 + lVar19 * 2;
  uVar20 = (ulong)pPage->hdrOffset;
  uVar1 = uVar20 + 1;
  uVar18 = uVar1;
  do {
    uVar4 = puVar6[uVar18];
    uVar5 = puVar6[uVar18 + 1];
    uVar16 = (uint)CONCAT11(uVar4,uVar5);
    if ((uVar10 <= uVar16) || (uVar16 == 0)) {
      if ((int)uVar16 <= (int)(pPage->pBt->usableSize - 4)) {
        puVar6[uVar18] = uVar2;
        puVar6[uVar18 + 1] = uVar3;
        puVar6[uVar10] = uVar4;
        puVar6[(ulong)uVar10 + 1] = uVar5;
        puVar6[(ulong)uVar10 + 2] = (u8)((uint)sz >> 8);
        puVar6[(ulong)uVar10 + 3] = (u8)sz;
        pPage->nFree = pPage->nFree + (short)sz;
        uVar18 = uVar1;
        goto LAB_0014302c;
      }
      uVar17 = 0xc6b2;
      goto LAB_00142f94;
    }
    iVar11 = (int)uVar18;
    uVar18 = (ulong)uVar16;
  } while (iVar11 + 4U <= uVar16);
  uVar17 = 0xc6ad;
LAB_00142f94:
  bVar9 = false;
  iVar11 = 0xb;
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar17,
              "118a3b35693b134d56ebd780123b7fd6f1497668");
  goto LAB_00142f9b;
  while( true ) {
    uVar13 = (ulong)uVar10;
    uVar14 = *(ushort *)(puVar6 + uVar13) << 8 | *(ushort *)(puVar6 + uVar13) >> 8;
    uVar15 = *(ushort *)(puVar6 + uVar13 + 2) << 8 | *(ushort *)(puVar6 + uVar13 + 2) >> 8;
    bVar9 = true;
    if (uVar14 - 1 < (uint)uVar15 + (uint)uVar10 + 3) {
      iVar11 = (uint)uVar14 - ((uint)uVar15 + (uint)uVar10);
      if ((iVar11 < 0) || ((int)(uint)puVar6[uVar20 + 7] < iVar11)) {
        bVar9 = false;
        sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xc6c5,
                    "118a3b35693b134d56ebd780123b7fd6f1497668");
        uVar13 = uVar18;
      }
      else {
        puVar6[uVar20 + 7] = puVar6[uVar20 + 7] - (char)iVar11;
        *(undefined2 *)(puVar6 + uVar13) = *(undefined2 *)(puVar6 + uVar14);
        uVar10 = (uVar14 - uVar10) + CONCAT11(puVar6[(ulong)uVar14 + 2],puVar6[(ulong)uVar14 + 3]);
        *(ushort *)(puVar6 + uVar13 + 2) = uVar10 * 0x100 | uVar10 >> 8;
        uVar13 = uVar18;
      }
    }
    uVar18 = uVar13;
    if (!bVar9) break;
LAB_0014302c:
    uVar10 = *(ushort *)(puVar6 + uVar18) << 8 | *(ushort *)(puVar6 + uVar18) >> 8;
    if (uVar10 == 0) {
      iVar11 = 0;
      bVar9 = true;
      if ((puVar6[uVar1] == puVar6[uVar20 + 5]) && (puVar6[uVar20 + 2] == puVar6[uVar20 + 6])) {
        uVar18 = (ulong)CONCAT11(puVar6[uVar1],puVar6[uVar20 + 2]);
        *(undefined2 *)(puVar6 + uVar1) = *(undefined2 *)(puVar6 + uVar18);
        uVar10 = CONCAT11(puVar6[uVar18 + 2],puVar6[uVar18 + 3]) +
                 CONCAT11(puVar6[uVar20 + 5],puVar6[uVar20 + 6]);
        *(ushort *)(puVar6 + uVar20 + 5) = uVar10 * 0x100 | uVar10 >> 8;
      }
      goto LAB_00142f9b;
    }
  }
  iVar11 = 0xb;
  bVar9 = false;
LAB_00142f9b:
  if (bVar9) {
    puVar8 = pPage->aCellIdx;
    uVar10 = pPage->nCell;
    for (; puVar7 < puVar8 + (ulong)uVar10 * 2 + -2; puVar7 = puVar7 + 2) {
      *(undefined2 *)puVar7 = *(undefined2 *)(puVar7 + 2);
    }
    iVar11 = *(int *)&pPage->nCell + -1;
    pPage->nCell = (u16)iVar11;
    puVar6[uVar12 + 3] = (u8)((uint)iVar11 >> 8);
    puVar6[uVar12 + 4] = (u8)pPage->nCell;
    pPage->nFree = pPage->nFree + 2;
  }
  else {
    *pRC = iVar11;
  }
  return;
}

Assistant:

static void dropCell(MemPage *pPage, int idx, int sz, int *pRC){
  u32 pc;         /* Offset to cell content of cell being deleted */
  u8 *data;       /* pPage->aData */
  u8 *ptr;        /* Used to move bytes around within data[] */
  u8 *endPtr;     /* End of loop */
  int rc;         /* The return code */
  int hdr;        /* Beginning of the header.  0 most pages.  100 page 1 */

  if( *pRC ) return;

  assert( idx>=0 && idx<pPage->nCell );
  assert( sz==cellSize(pPage, idx) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  ptr = &pPage->aCellIdx[2*idx];
  pc = get2byte(ptr);
  hdr = pPage->hdrOffset;
  testcase( pc==get2byte(&data[hdr+5]) );
  testcase( pc+sz==pPage->pBt->usableSize );
  if( pc < (u32)get2byte(&data[hdr+5]) || pc+sz > pPage->pBt->usableSize ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  rc = freeSpace(pPage, pc, sz);
  if( rc ){
    *pRC = rc;
    return;
  }
  endPtr = &pPage->aCellIdx[2*pPage->nCell - 2];
  assert( (SQLITE_PTR_TO_INT(ptr)&1)==0 );  /* ptr is always 2-byte aligned */
  while( ptr<endPtr ){
    *(u16*)ptr = *(u16*)&ptr[2];
    ptr += 2;
  }
  pPage->nCell--;
  put2byte(&data[hdr+3], pPage->nCell);
  pPage->nFree += 2;
}